

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O2

TestResult ** srunner_failures(SRunner *sr)

{
  List *lp;
  int iVar1;
  TestResult **ppTVar2;
  TestResult *pTVar3;
  long lVar4;
  int iVar5;
  
  ppTVar2 = (TestResult **)emalloc(((long)sr->stats->n_errors + (long)sr->stats->n_failed) * 8);
  lp = sr->resultlst;
  check_list_front(lp);
  iVar5 = 0;
  while( true ) {
    iVar1 = check_list_at_end(lp);
    if (iVar1 != 0) break;
    pTVar3 = (TestResult *)check_list_val(lp);
    if (pTVar3->rtype != CK_PASS) {
      lVar4 = (long)iVar5;
      iVar5 = iVar5 + 1;
      ppTVar2[lVar4] = pTVar3;
    }
    check_list_advance(lp);
  }
  return ppTVar2;
}

Assistant:

TestResult **srunner_failures(SRunner * sr)
{
    int i = 0;
    TestResult **trarray;
    List *rlst;

    trarray = (TestResult **)emalloc(sizeof(trarray[0]) * srunner_ntests_failed(sr));

    rlst = sr->resultlst;
    for(check_list_front(rlst); !check_list_at_end(rlst);
        check_list_advance(rlst))
    {
        TestResult *tr = (TestResult *)check_list_val(rlst);

        if(non_pass(tr->rtype))
            trarray[i++] = tr;

    }
    return trarray;
}